

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O0

void google::protobuf::compiler::cpp::AddAccessorAnnotations
               (FieldDescriptor *descriptor,Options *options,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  StringPiece field_member_00;
  StringPiece prepared_template_00;
  StringPiece prepared_template_01;
  StringPiece prepared_template_02;
  StringPiece prepared_template_03;
  StringPiece prepared_template_04;
  StringPiece prepared_template_05;
  StringPiece prepared_template_06;
  StringPiece prepared_template_07;
  StringPiece prepared_template_08;
  StringPiece prepared_template_09;
  StringPiece prepared_template_10;
  StringPiece access_type;
  StringPiece access_type_00;
  StringPiece access_type_01;
  StringPiece access_type_02;
  StringPiece access_type_03;
  StringPiece access_type_04;
  StringPiece access_type_05;
  StringPiece access_type_06;
  StringPiece access_type_07;
  StringPiece access_type_08;
  StringPiece access_type_09;
  size_t sVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar2;
  Options *this;
  bool bVar3;
  FileOptions_OptimizeMode FVar4;
  Type TVar5;
  CppType CVar6;
  mapped_type *pmVar7;
  FileDescriptor *this_00;
  FileOptions *this_01;
  string *str;
  FieldOptions *this_02;
  char *pcVar8;
  AlphaNum *in_RCX;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  int __c_06;
  int __c_07;
  int __c_08;
  int __c_09;
  FieldDescriptor *field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  AlphaNum *in_R8;
  StringPiece proto_ns_00;
  StringPiece field_member_01;
  char *in_stack_fffffffffffff238;
  size_type in_stack_fffffffffffff240;
  StringPiece local_bd8;
  StringPiece local_bc8;
  StringPiece local_bb8;
  StringPiece local_ba8;
  StringPiece local_b98;
  StringPiece local_b88;
  StringPiece local_b78;
  StringPiece local_b68;
  StringPiece local_b58;
  StringPiece local_b48;
  StringPiece local_b38;
  StringPiece local_b28;
  StringPiece local_b18;
  StringPiece local_b08;
  StringPiece local_af8;
  StringPiece local_ae8;
  StringPiece local_ad8;
  StringPiece local_ac8;
  StringPiece local_ab8;
  StringPiece local_aa8;
  StringPiece local_a98;
  StringPiece local_a88;
  StringPiece local_a78;
  StringPiece local_a68;
  StringPiece local_a58;
  StringPiece local_a48;
  StringPiece local_a38;
  StringPiece local_a28;
  StringPiece local_a18;
  StringPiece local_a08;
  StringPiece local_9f8;
  StringPiece local_9e8;
  StringPiece local_9d8;
  StringPiece local_9c8;
  StringPiece local_9b8;
  StringPiece local_9a8;
  StringPiece local_998;
  StringPiece local_988;
  StringPiece local_978;
  StringPiece local_968;
  StringPiece local_958;
  StringPiece local_948;
  StringPiece local_938;
  StringPiece local_928;
  AlphaNum local_918;
  AlphaNum local_8e8;
  string local_8b8;
  AlphaNum local_898;
  AlphaNum local_868;
  string local_838;
  StringPiece local_818;
  string local_808;
  StringPiece local_7e8;
  allocator local_7d1;
  key_type local_7d0;
  StringPiece local_7b0;
  string local_7a0;
  SubstituteArg local_780;
  SubstituteArg local_750;
  SubstituteArg local_720;
  SubstituteArg local_6f0;
  SubstituteArg local_6c0;
  SubstituteArg local_690;
  SubstituteArg local_660;
  SubstituteArg local_630;
  AlphaNum local_600;
  SubstituteArg local_5d0;
  allocator local_599;
  string local_598;
  string local_578;
  SubstituteArg local_558;
  SubstituteArg local_528;
  SubstituteArg local_4f8;
  SubstituteArg local_4c8;
  SubstituteArg local_498;
  SubstituteArg local_468;
  SubstituteArg local_438;
  SubstituteArg local_408;
  SubstituteArg local_3d8;
  SubstituteArg local_3a8;
  allocator local_371;
  string local_370;
  string local_350;
  undefined1 local_330 [8];
  string prepared_add_template;
  string prepared_flat_template;
  string prepared_template;
  undefined1 local_2c8 [8];
  string substitute_template_prefix;
  key_type local_2a0;
  string local_280 [8];
  string proto_ns;
  AlphaNum local_230;
  AlphaNum local_200;
  string local_1d0;
  OneofDescriptor *local_1b0;
  OneofDescriptor *oneof_member;
  key_type local_1a0;
  undefined1 local_180 [8];
  string field_member;
  key_type local_158;
  AlphaNum local_138;
  string local_108;
  AlphaNum local_e8;
  AlphaNum local_b8;
  string local_88;
  AlphaNum *local_68;
  size_t i_1;
  allocator local_49;
  key_type local_48;
  AlphaNum *local_28;
  size_t i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  Options *options_local;
  FieldDescriptor *descriptor_local;
  
  i = (size_t)variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)options;
  options_local = (Options *)descriptor;
  for (local_28 = (AlphaNum *)0x0; sVar1 = i, local_28 < (AlphaNum *)0xb;
      local_28 = (AlphaNum *)((long)&local_28->piece_data_ + 1)) {
    pcVar8 = AddAccessorAnnotations::kAccessorsAnnotations[(long)local_28];
    in_RCX = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,pcVar8,&local_49);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)sVar1,&local_48);
    std::__cxx11::string::operator=((string *)pmVar7,"");
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  if (((variables_local->_M_t)._M_impl.super__Rb_tree_header._M_node_count & 0x10000000000) != 0) {
    for (local_68 = (AlphaNum *)0x0; local_68 < (AlphaNum *)0xb;
        local_68 = (AlphaNum *)((long)&local_68->piece_data_ + 1)) {
      strings::AlphaNum::AlphaNum(&local_b8,"  ");
      FieldName_abi_cxx11_(&local_108,(cpp *)options_local,field);
      strings::AlphaNum::AlphaNum(&local_e8,&local_108);
      strings::AlphaNum::AlphaNum(&local_138,"_AccessedNoStrip = true;\n");
      StrCat_abi_cxx11_(&local_88,(protobuf *)&local_b8,&local_e8,&local_138,in_R8);
      sVar1 = i;
      pcVar8 = AddAccessorAnnotations::kAccessorsAnnotations[(long)local_68];
      in_RCX = local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_158,pcVar8,(allocator *)(field_member.field_2._M_local_buf + 0xf))
      ;
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)sVar1,&local_158);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator((allocator<char> *)(field_member.field_2._M_local_buf + 0xf))
      ;
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_108);
    }
  }
  if (((ulong)variables_local[3]._M_t._M_impl.super__Rb_tree_header._M_header._M_right & 1) == 0) {
    return;
  }
  this_00 = FieldDescriptor::file((FieldDescriptor *)options_local);
  this_01 = FileDescriptor::options(this_00);
  FVar4 = FileOptions::optimize_for(this_01);
  sVar1 = i;
  if (FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME) {
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1a0,"field_member",(allocator *)((long)&oneof_member + 7));
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)sVar1,&local_1a0);
  std::__cxx11::string::string((string *)local_180,(string *)pmVar7);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&oneof_member + 7));
  local_1b0 = FieldDescriptor::real_containing_oneof((FieldDescriptor *)options_local);
  if (local_1b0 != (OneofDescriptor *)0x0) {
    str = OneofDescriptor::name_abi_cxx11_(local_1b0);
    strings::AlphaNum::AlphaNum(&local_200,str);
    strings::AlphaNum::AlphaNum(&local_230,"_.");
    strings::AlphaNum::AlphaNum((AlphaNum *)((long)&proto_ns.field_2 + 8),(string *)local_180);
    in_RCX = (AlphaNum *)((long)&proto_ns.field_2 + 8);
    StrCat_abi_cxx11_(&local_1d0,(protobuf *)&local_200,&local_230,in_RCX,in_R8);
    std::__cxx11::string::operator=((string *)local_180,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  sVar1 = i;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2a0,"proto_ns",
             (allocator *)(substitute_template_prefix.field_2._M_local_buf + 0xf));
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)sVar1,&local_2a0);
  std::__cxx11::string::string(local_280,(string *)pmVar7);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(substitute_template_prefix.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_2c8,"  _tracker_.$1<$0>(this, ",
             (allocator *)(prepared_template.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(prepared_template.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(prepared_flat_template.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(prepared_add_template.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_330);
  bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)options_local);
  if ((!bVar3) || (bVar3 = FieldDescriptor::is_map((FieldDescriptor *)options_local), bVar3)) {
    bVar3 = FieldDescriptor::is_map((FieldDescriptor *)options_local);
    if (bVar3) {
      std::__cxx11::string::operator=
                ((string *)(prepared_flat_template.field_2._M_local_buf + 8),"nullptr");
    }
    else {
      TVar5 = FieldDescriptor::type((FieldDescriptor *)options_local);
      if (TVar5 == TYPE_MESSAGE) {
        this_02 = FieldDescriptor::options((FieldDescriptor *)options_local);
        bVar3 = FieldOptions::lazy(this_02);
        if (!bVar3) {
          std::__cxx11::string::operator=
                    ((string *)(prepared_flat_template.field_2._M_local_buf + 8),"nullptr");
          goto LAB_0058fbf1;
        }
      }
      CVar6 = FieldDescriptor::cpp_type((FieldDescriptor *)options_local);
      this = options_local;
      sVar1 = i;
      if (CVar6 == CPPTYPE_STRING) {
        if (local_1b0 == (OneofDescriptor *)0x0) {
          stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                    (&local_818,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180)
          ;
          field_member_01.length_ = (size_type)in_R8;
          field_member_01.ptr_ = (char *)local_818.length_;
          (anonymous_namespace)::GenerateTemplateForSingleString_abi_cxx11_
                    (&local_808,(_anonymous_namespace_ *)this,(FieldDescriptor *)local_818.ptr_,
                     field_member_01);
          std::__cxx11::string::operator=
                    ((string *)(prepared_flat_template.field_2._M_local_buf + 8),
                     (string *)&local_808);
          std::__cxx11::string::~string((string *)&local_808);
          in_RCX = (AlphaNum *)local_818.length_;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_7d0,"proto_ns",&local_7d1);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)sVar1,&local_7d0);
          stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_7b0,pmVar7);
          stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                    (&local_7e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180)
          ;
          field_member_00.length_ = in_stack_fffffffffffff240;
          field_member_00.ptr_ = in_stack_fffffffffffff238;
          proto_ns_00.length_ = (size_type)local_7e8.ptr_;
          proto_ns_00.ptr_ = (char *)local_7b0.length_;
          (anonymous_namespace)::GenerateTemplateForOneofString_abi_cxx11_
                    (&local_7a0,(_anonymous_namespace_ *)this,(FieldDescriptor *)local_7b0.ptr_,
                     proto_ns_00,field_member_00);
          std::__cxx11::string::operator=
                    ((string *)(prepared_flat_template.field_2._M_local_buf + 8),
                     (string *)&local_7a0);
          std::__cxx11::string::~string((string *)&local_7a0);
          std::__cxx11::string::~string((string *)&local_7d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
          in_RCX = (AlphaNum *)local_7b0.length_;
        }
      }
      else {
        strings::AlphaNum::AlphaNum(&local_868,"&");
        strings::AlphaNum::AlphaNum(&local_898,(string *)local_180);
        StrCat_abi_cxx11_(&local_838,(protobuf *)&local_868,&local_898,in_RCX);
        std::__cxx11::string::operator=
                  ((string *)(prepared_flat_template.field_2._M_local_buf + 8),(string *)&local_838)
        ;
        std::__cxx11::string::~string((string *)&local_838);
      }
    }
  }
  else {
    TVar5 = FieldDescriptor::type((FieldDescriptor *)options_local);
    if ((TVar5 == TYPE_MESSAGE) ||
       (TVar5 = FieldDescriptor::type((FieldDescriptor *)options_local), TVar5 == TYPE_GROUP)) {
      std::__cxx11::string::operator=
                ((string *)(prepared_flat_template.field_2._M_local_buf + 8),"nullptr");
      std::__cxx11::string::operator=((string *)local_330,"nullptr");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_370,"&$0.Get(index)",&local_371);
      strings::internal::SubstituteArg::SubstituteArg(&local_3a8,(string *)local_180);
      strings::internal::SubstituteArg::SubstituteArg(&local_3d8);
      strings::internal::SubstituteArg::SubstituteArg(&local_408);
      strings::internal::SubstituteArg::SubstituteArg(&local_438);
      strings::internal::SubstituteArg::SubstituteArg(&local_468);
      strings::internal::SubstituteArg::SubstituteArg(&local_498);
      strings::internal::SubstituteArg::SubstituteArg(&local_4c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_4f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_528);
      strings::internal::SubstituteArg::SubstituteArg(&local_558);
      strings::Substitute(&local_350,&local_370,&local_3a8,&local_3d8,&local_408,&local_438,
                          &local_468,&local_498,&local_4c8,&local_4f8,&local_528,&local_558);
      std::__cxx11::string::operator=
                ((string *)(prepared_flat_template.field_2._M_local_buf + 8),(string *)&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_370);
      std::allocator<char>::~allocator((allocator<char> *)&local_371);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_598,"&$0.Get($0.size() - 1)",&local_599);
      strings::internal::SubstituteArg::SubstituteArg(&local_5d0,(string *)local_180);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&local_600);
      strings::internal::SubstituteArg::SubstituteArg(&local_630);
      strings::internal::SubstituteArg::SubstituteArg(&local_660);
      strings::internal::SubstituteArg::SubstituteArg(&local_690);
      strings::internal::SubstituteArg::SubstituteArg(&local_6c0);
      strings::internal::SubstituteArg::SubstituteArg(&local_6f0);
      strings::internal::SubstituteArg::SubstituteArg(&local_720);
      strings::internal::SubstituteArg::SubstituteArg(&local_750);
      strings::internal::SubstituteArg::SubstituteArg(&local_780);
      in_RCX = &local_600;
      strings::Substitute(&local_578,&local_598,&local_5d0,(SubstituteArg *)in_RCX,&local_630,
                          &local_660,&local_690,&local_6c0,&local_6f0,&local_720,&local_750,
                          &local_780);
      std::__cxx11::string::operator=((string *)local_330,(string *)&local_578);
      std::__cxx11::string::~string((string *)&local_578);
      std::__cxx11::string::~string((string *)&local_598);
      std::allocator<char>::~allocator((allocator<char> *)&local_599);
    }
  }
LAB_0058fbf1:
  bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)options_local);
  if ((((!bVar3) || (bVar3 = FieldDescriptor::is_map((FieldDescriptor *)options_local), bVar3)) ||
      (TVar5 = FieldDescriptor::type((FieldDescriptor *)options_local), TVar5 == TYPE_MESSAGE)) ||
     (TVar5 = FieldDescriptor::type((FieldDescriptor *)options_local), TVar5 == TYPE_GROUP)) {
    std::__cxx11::string::operator=
              ((string *)(prepared_add_template.field_2._M_local_buf + 8),
               (string *)(prepared_flat_template.field_2._M_local_buf + 8));
  }
  else {
    strings::AlphaNum::AlphaNum(&local_8e8,"&");
    strings::AlphaNum::AlphaNum(&local_918,(string *)local_180);
    StrCat_abi_cxx11_(&local_8b8,(protobuf *)&local_8e8,&local_918,in_RCX);
    std::__cxx11::string::operator=
              ((string *)(prepared_add_template.field_2._M_local_buf + 8),(string *)&local_8b8);
    std::__cxx11::string::~string((string *)&local_8b8);
  }
  pmVar2 = variables_local;
  stringpiece_internal::StringPiece::StringPiece(&local_928,"get");
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_938,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (prepared_flat_template.field_2._M_local_buf + 8);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_948,pbVar9);
  pcVar8 = FieldDescriptor::index((FieldDescriptor *)options_local,(char *)pbVar9,__c);
  stringpiece_internal::StringPiece::StringPiece(&local_958,"OnGet");
  prepared_template_00.length_ = local_948.length_;
  prepared_template_00.ptr_ = local_948.ptr_;
  access_type.length_ = local_958.length_;
  access_type.ptr_ = local_958.ptr_;
  anon_unknown_7::MaySetAnnotationVariable
            ((Options *)pmVar2,local_928,local_938,prepared_template_00,(int)pcVar8,access_type,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)i);
  pmVar2 = variables_local;
  stringpiece_internal::StringPiece::StringPiece(&local_968,"set");
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_978,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (prepared_flat_template.field_2._M_local_buf + 8);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_988,pbVar9);
  pcVar8 = FieldDescriptor::index((FieldDescriptor *)options_local,(char *)pbVar9,__c_00);
  stringpiece_internal::StringPiece::StringPiece(&local_998,"OnSet");
  prepared_template_01.length_ = local_988.length_;
  prepared_template_01.ptr_ = local_988.ptr_;
  access_type_00.length_ = local_998.length_;
  access_type_00.ptr_ = local_998.ptr_;
  anon_unknown_7::MaySetAnnotationVariable
            ((Options *)pmVar2,local_968,local_978,prepared_template_01,(int)pcVar8,access_type_00,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)i);
  pmVar2 = variables_local;
  stringpiece_internal::StringPiece::StringPiece(&local_9a8,"has");
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_9b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (prepared_flat_template.field_2._M_local_buf + 8);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_9c8,pbVar9);
  pcVar8 = FieldDescriptor::index((FieldDescriptor *)options_local,(char *)pbVar9,__c_01);
  stringpiece_internal::StringPiece::StringPiece(&local_9d8,"OnHas");
  prepared_template_02.length_ = local_9c8.length_;
  prepared_template_02.ptr_ = local_9c8.ptr_;
  access_type_01.length_ = local_9d8.length_;
  access_type_01.ptr_ = local_9d8.ptr_;
  anon_unknown_7::MaySetAnnotationVariable
            ((Options *)pmVar2,local_9a8,local_9b8,prepared_template_02,(int)pcVar8,access_type_01,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)i);
  pmVar2 = variables_local;
  stringpiece_internal::StringPiece::StringPiece(&local_9e8,"mutable");
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_9f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (prepared_flat_template.field_2._M_local_buf + 8);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_a08,pbVar9);
  pcVar8 = FieldDescriptor::index((FieldDescriptor *)options_local,(char *)pbVar9,__c_02);
  stringpiece_internal::StringPiece::StringPiece(&local_a18,"OnMutable");
  prepared_template_03.length_ = local_a08.length_;
  prepared_template_03.ptr_ = local_a08.ptr_;
  access_type_02.length_ = local_a18.length_;
  access_type_02.ptr_ = local_a18.ptr_;
  anon_unknown_7::MaySetAnnotationVariable
            ((Options *)pmVar2,local_9e8,local_9f8,prepared_template_03,(int)pcVar8,access_type_02,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)i);
  pmVar2 = variables_local;
  stringpiece_internal::StringPiece::StringPiece(&local_a28,"release");
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_a38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (prepared_flat_template.field_2._M_local_buf + 8);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_a48,pbVar9);
  pcVar8 = FieldDescriptor::index((FieldDescriptor *)options_local,(char *)pbVar9,__c_03);
  stringpiece_internal::StringPiece::StringPiece(&local_a58,"OnRelease");
  prepared_template_04.length_ = local_a48.length_;
  prepared_template_04.ptr_ = local_a48.ptr_;
  access_type_03.length_ = local_a58.length_;
  access_type_03.ptr_ = local_a58.ptr_;
  anon_unknown_7::MaySetAnnotationVariable
            ((Options *)pmVar2,local_a28,local_a38,prepared_template_04,(int)pcVar8,access_type_03,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)i);
  pmVar2 = variables_local;
  stringpiece_internal::StringPiece::StringPiece(&local_a68,"clear");
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_a78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (prepared_add_template.field_2._M_local_buf + 8);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_a88,pbVar9);
  pcVar8 = FieldDescriptor::index((FieldDescriptor *)options_local,(char *)pbVar9,__c_04);
  stringpiece_internal::StringPiece::StringPiece(&local_a98,"OnClear");
  prepared_template_05.length_ = local_a88.length_;
  prepared_template_05.ptr_ = local_a88.ptr_;
  access_type_04.length_ = local_a98.length_;
  access_type_04.ptr_ = local_a98.ptr_;
  anon_unknown_7::MaySetAnnotationVariable
            ((Options *)pmVar2,local_a68,local_a78,prepared_template_05,(int)pcVar8,access_type_04,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)i);
  pmVar2 = variables_local;
  stringpiece_internal::StringPiece::StringPiece(&local_aa8,"size");
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_ab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (prepared_add_template.field_2._M_local_buf + 8);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_ac8,pbVar9);
  pcVar8 = FieldDescriptor::index((FieldDescriptor *)options_local,(char *)pbVar9,__c_05);
  stringpiece_internal::StringPiece::StringPiece(&local_ad8,"OnSize");
  prepared_template_06.length_ = local_ac8.length_;
  prepared_template_06.ptr_ = local_ac8.ptr_;
  access_type_05.length_ = local_ad8.length_;
  access_type_05.ptr_ = local_ad8.ptr_;
  anon_unknown_7::MaySetAnnotationVariable
            ((Options *)pmVar2,local_aa8,local_ab8,prepared_template_06,(int)pcVar8,access_type_05,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)i);
  pmVar2 = variables_local;
  stringpiece_internal::StringPiece::StringPiece(&local_ae8,"list");
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_af8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (prepared_add_template.field_2._M_local_buf + 8);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_b08,pbVar9);
  pcVar8 = FieldDescriptor::index((FieldDescriptor *)options_local,(char *)pbVar9,__c_06);
  stringpiece_internal::StringPiece::StringPiece(&local_b18,"OnList");
  prepared_template_07.length_ = local_b08.length_;
  prepared_template_07.ptr_ = local_b08.ptr_;
  access_type_06.length_ = local_b18.length_;
  access_type_06.ptr_ = local_b18.ptr_;
  anon_unknown_7::MaySetAnnotationVariable
            ((Options *)pmVar2,local_ae8,local_af8,prepared_template_07,(int)pcVar8,access_type_06,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)i);
  pmVar2 = variables_local;
  stringpiece_internal::StringPiece::StringPiece(&local_b28,"mutable_list");
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_b38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (prepared_add_template.field_2._M_local_buf + 8);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_b48,pbVar9);
  pcVar8 = FieldDescriptor::index((FieldDescriptor *)options_local,(char *)pbVar9,__c_07);
  stringpiece_internal::StringPiece::StringPiece(&local_b58,"OnMutableList");
  prepared_template_08.length_ = local_b48.length_;
  prepared_template_08.ptr_ = local_b48.ptr_;
  access_type_07.length_ = local_b58.length_;
  access_type_07.ptr_ = local_b58.ptr_;
  anon_unknown_7::MaySetAnnotationVariable
            ((Options *)pmVar2,local_b28,local_b38,prepared_template_08,(int)pcVar8,access_type_07,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)i);
  pmVar2 = variables_local;
  stringpiece_internal::StringPiece::StringPiece(&local_b68,"add");
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_b78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330;
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_b88,pbVar9);
  pcVar8 = FieldDescriptor::index((FieldDescriptor *)options_local,(char *)pbVar9,__c_08);
  stringpiece_internal::StringPiece::StringPiece(&local_b98,"OnAdd");
  prepared_template_09.length_ = local_b88.length_;
  prepared_template_09.ptr_ = local_b88.ptr_;
  access_type_08.length_ = local_b98.length_;
  access_type_08.ptr_ = local_b98.ptr_;
  anon_unknown_7::MaySetAnnotationVariable
            ((Options *)pmVar2,local_b68,local_b78,prepared_template_09,(int)pcVar8,access_type_08,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)i);
  pmVar2 = variables_local;
  stringpiece_internal::StringPiece::StringPiece(&local_ba8,"add_mutable");
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_bb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330;
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_bc8,pbVar9);
  pcVar8 = FieldDescriptor::index((FieldDescriptor *)options_local,(char *)pbVar9,__c_09);
  stringpiece_internal::StringPiece::StringPiece(&local_bd8,"OnAddMutable");
  prepared_template_10.length_ = local_bc8.length_;
  prepared_template_10.ptr_ = local_bc8.ptr_;
  access_type_09.length_ = local_bd8.length_;
  access_type_09.ptr_ = local_bd8.ptr_;
  anon_unknown_7::MaySetAnnotationVariable
            ((Options *)pmVar2,local_ba8,local_bb8,prepared_template_10,(int)pcVar8,access_type_09,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)i);
  std::__cxx11::string::~string((string *)local_330);
  std::__cxx11::string::~string((string *)(prepared_add_template.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(prepared_flat_template.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_2c8);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string((string *)local_180);
  return;
}

Assistant:

void AddAccessorAnnotations(const FieldDescriptor* descriptor,
                            const Options& options,
                            std::map<std::string, std::string>* variables) {
  // Can be expanded to include more specific calls, for example, for arena or
  // clear calls.
  static constexpr const char* kAccessorsAnnotations[] = {
      "annotate_add",     "annotate_get",         "annotate_has",
      "annotate_list",    "annotate_mutable",     "annotate_mutable_list",
      "annotate_release", "annotate_set",         "annotate_size",
      "annotate_clear",   "annotate_add_mutable",
  };
  for (size_t i = 0; i < GOOGLE_ARRAYSIZE(kAccessorsAnnotations); ++i) {
    (*variables)[kAccessorsAnnotations[i]] = "";
  }
  if (options.annotate_accessor) {
    for (size_t i = 0; i < GOOGLE_ARRAYSIZE(kAccessorsAnnotations); ++i) {
      (*variables)[kAccessorsAnnotations[i]] = StrCat(
          "  ", FieldName(descriptor), "_AccessedNoStrip = true;\n");
    }
  }
  if (!options.field_listener_options.inject_field_listener_events) {
    return;
  }
  if (descriptor->file()->options().optimize_for() ==
      google::protobuf::FileOptions::LITE_RUNTIME) {
    return;
  }
  std::string field_member = (*variables)["field_member"];
  const google::protobuf::OneofDescriptor* oneof_member =
      descriptor->real_containing_oneof();
  if (oneof_member) {
    field_member = StrCat(oneof_member->name(), "_.", field_member);
  }
  const std::string proto_ns = (*variables)["proto_ns"];
  const std::string substitute_template_prefix = "  _tracker_.$1<$0>(this, ";
  std::string prepared_template;

  // Flat template is needed if the prepared one is introspecting the values
  // inside the returned values, for example, for repeated fields and maps.
  std::string prepared_flat_template;
  std::string prepared_add_template;
  // TODO(b/190614678): Support fields with type Message or Map.
  if (descriptor->is_repeated() && !descriptor->is_map()) {
    if (descriptor->type() != FieldDescriptor::TYPE_MESSAGE &&
        descriptor->type() != FieldDescriptor::TYPE_GROUP) {
      prepared_template = strings::Substitute("&$0.Get(index)", field_member);
      prepared_add_template =
          strings::Substitute("&$0.Get($0.size() - 1)", field_member);
    } else {
      prepared_template = "nullptr";
      prepared_add_template = "nullptr";
    }
  } else if (descriptor->is_map()) {
    prepared_template = "nullptr";
  } else if (descriptor->type() == FieldDescriptor::TYPE_MESSAGE &&
             !descriptor->options().lazy()) {
    prepared_template = "nullptr";
  } else if (descriptor->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    if (oneof_member) {
      prepared_template = GenerateTemplateForOneofString(
          descriptor, (*variables)["proto_ns"], field_member);
    } else {
      prepared_template =
          GenerateTemplateForSingleString(descriptor, field_member);
    }
  } else {
    prepared_template = StrCat("&", field_member);
  }
  if (descriptor->is_repeated() && !descriptor->is_map() &&
      descriptor->type() != FieldDescriptor::TYPE_MESSAGE &&
      descriptor->type() != FieldDescriptor::TYPE_GROUP) {
    prepared_flat_template = StrCat("&", field_member);
  } else {
    prepared_flat_template = prepared_template;
  }

  MaySetAnnotationVariable(options, "get", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnGet",
                           variables);
  MaySetAnnotationVariable(options, "set", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnSet",
                           variables);
  MaySetAnnotationVariable(options, "has", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnHas",
                           variables);
  MaySetAnnotationVariable(options, "mutable", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnMutable",
                           variables);
  MaySetAnnotationVariable(options, "release", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnRelease",
                           variables);
  MaySetAnnotationVariable(options, "clear", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnClear", variables);
  MaySetAnnotationVariable(options, "size", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnSize", variables);
  MaySetAnnotationVariable(options, "list", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnList", variables);
  MaySetAnnotationVariable(options, "mutable_list", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnMutableList", variables);
  MaySetAnnotationVariable(options, "add", substitute_template_prefix,
                           prepared_add_template, descriptor->index(), "OnAdd",
                           variables);
  MaySetAnnotationVariable(options, "add_mutable", substitute_template_prefix,
                           prepared_add_template, descriptor->index(),
                           "OnAddMutable", variables);
}